

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O2

void __thiscall
database::Container::_SelectRawDataSetWithCriteria
          (Container *this,impl_filter_type *filter_criteria,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dataset,function<void_(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_&)>
                   *lambda)

{
  pointer pbVar1;
  pointer puVar2;
  bool bVar3;
  const_iterator cVar4;
  difference_type dVar5;
  mapped_type *this_00;
  _Base_ptr p_Var6;
  runtime_error *this_01;
  pointer puVar7;
  pointer pbVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  required_columns;
  vector<unsigned_long,_std::allocator<unsigned_long>_> primary_index_vector;
  vector<database::ComparableString,_std::allocator<database::ComparableString>_> local_d8;
  impl_dataset_type result;
  value_type column;
  key_type local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>
  local_58;
  
  bVar3 = _IsValidFilterCriteriaForRawSelection(this,filter_criteria);
  if (bVar3) {
    bVar3 = _IsValidDataSetRequested(this,dataset);
    if (bVar3) {
      result._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = &primary_index_vector;
      primary_index_vector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      primary_index_vector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      primary_index_vector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      result._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Container.cpp:151:38)>
           ::_M_invoke;
      result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Container.cpp:151:38)>
           ::_M_manager;
      result._M_t._M_impl._0_8_ = this;
      _for_each_criteria(filter_criteria,
                         (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>)>
                          *)&result);
      std::_Function_base::~_Function_base((_Function_base *)&result);
      result._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &result._M_t._M_impl.super__Rb_tree_header._M_header;
      result._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           result._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      result._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      required_columns.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      required_columns.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      required_columns.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      result._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           result._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((dataset->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start ==
          (dataset->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        for (p_Var6 = (this->m_schema)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &(this->m_schema)._M_t._M_impl.super__Rb_tree_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>
          ::pair(&local_58,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>
                  *)(p_Var6 + 1));
          std::__cxx11::string::string((string *)&local_78,(string *)&local_58);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &required_columns,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_58);
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&required_columns,dataset);
      }
      pbVar1 = required_columns.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = required_columns.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1; pbVar8 = pbVar8 + 1
          ) {
        std::__cxx11::string::string((string *)&local_78,(string *)pbVar8);
        p_Var6 = (this->m_schema)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
                ::find(&(this->m_schema)._M_t,&local_78);
        dVar5 = std::
                __distance<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,database::DataType>>>
                          (p_Var6,cVar4._M_node);
        std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>::vector
                  (&column,(vector<database::ComparableString,_std::allocator<database::ComparableString>_>
                            *)(dVar5 * 0x18 +
                              *(long *)&(((this->m_data)._M_t.
                                          super___uniq_ptr_impl<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_*,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_*,_false>
                                         ._M_head_impl)->
                                        super__Vector_base<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>
                                        )._M_impl));
        puVar2 = primary_index_vector.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_d8.
        super__Vector_base<database::ComparableString,_std::allocator<database::ComparableString>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d8.
        super__Vector_base<database::ComparableString,_std::allocator<database::ComparableString>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.
        super__Vector_base<database::ComparableString,_std::allocator<database::ComparableString>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        for (puVar7 = primary_index_vector.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1) {
          ComparableString::ComparableString
                    ((ComparableString *)&local_58,
                     column.
                     super__Vector_base<database::ComparableString,_std::allocator<database::ComparableString>_>
                     ._M_impl.super__Vector_impl_data._M_start + *puVar7);
          std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>::
          emplace_back<database::ComparableString>(&local_d8,(ComparableString *)&local_58);
          std::__cxx11::string::~string((string *)&local_58);
        }
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>
                  ::operator[](&result,&local_78);
        std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>::
        operator=(this_00,&local_d8);
        std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>::
        ~vector(&local_d8);
        std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>::
        ~vector(&column);
        std::__cxx11::string::~string((string *)&local_78);
      }
      std::
      function<void_(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_&)>
      ::operator()(lambda,&result);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&required_columns);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>
      ::~_Rb_tree(&result._M_t);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&primary_index_vector.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"One or more of requested columns are not present in schema");
  }
  else {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Select attempted with invalid column identifiers");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void database::Container::_SelectRawDataSetWithCriteria(const database::impl_filter_type& filter_criteria,const std::vector<std::string>& dataset,const std::function<void(const database::impl_dataset_type&)>& lambda) const
{
  //! Check validity of the provided key-value criteria against defined schema
  if(!database::Container::_IsValidFilterCriteriaForRawSelection(filter_criteria)) 
    throw std::runtime_error("Select attempted with invalid column identifiers");

  //! Check if the requested dataset is valid
  if(!_IsValidDataSetRequested(dataset))
    throw std::runtime_error("One or more of requested columns are not present in schema");

  //! Will have the final filtered indices for the values that match the criteria
  std::vector<size_t> primary_index_vector;

  //! Iterating over each key-value pair in the filter_criteria and filter_comparison_type
  _for_each_criteria(filter_criteria,[&](auto filter_column,auto comparison_params){

    //! This is the index of the column on which filtering must be applied
    size_t filter_column_index = std::distance(m_schema.begin(),m_schema.find(filter_column));
    database::DataType column_type = m_schema.at(filter_column);

    std::vector<size_t> secondary_index_vector;

    //! Iterating over each pair of corresponding value and respective compare_type provided in the given filter
    _for_each_comparison(comparison_params,[&](auto value,auto compare) {
      auto column = m_data -> operator[](filter_column_index);
      
      std::vector<size_t> tertiary_index_vector;

      //! Iterating over each value in the given column to check if the filter criterion is satisfied O(n^3)
      for(size_t i = 0; i < column.size(); i += 1)
      {
        switch (compare)
        {
          case equal_to: if(column[i] == value) tertiary_index_vector.emplace_back(i); break;
          case not_equal_to: if(column[i] != value) tertiary_index_vector.emplace_back(i); break;
          case greater_or_equal_to: if(column[i] >= value) tertiary_index_vector.emplace_back(i); break;
          case lesser_or_equal_to: if(column[i] <= value) tertiary_index_vector.emplace_back(i); break;
          case greater_than: if(column[i] > value) tertiary_index_vector.emplace_back(i); break;
          case lesser_than: if(column[i] < value) tertiary_index_vector.emplace_back(i); break;
        }
      }
      secondary_index_vector = _ExecuteCustomIntersection(secondary_index_vector,tertiary_index_vector,column_type);
    });
    primary_index_vector = _ExecuteCustomIntersection(primary_index_vector,secondary_index_vector,column_type);
  });

  //! Extract data with the filtered indices
  database::impl_dataset_type result; 

  std::vector<std::string> required_columns;
  if(dataset.empty())
    std::transform(m_schema.begin(),m_schema.end(),std::back_inserter(required_columns),[&](auto pair){ return pair.first; });
  else
    required_columns = dataset;

  for_each(required_columns.begin(),required_columns.end(),[&](auto column_name) {
    size_t column_index = std::distance(m_schema.begin(),m_schema.find(column_name));
    auto column = m_data -> operator[](column_index);

    std::vector<database::ComparableString> data_buffer;
    std::transform(primary_index_vector.begin(),primary_index_vector.end(),std::back_inserter(data_buffer),[&](auto index) {
      return column[index];
    });
    result[column_name] = data_buffer;
  });
  lambda(result);
}